

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::notifyLayoutDirectionChange(QApplicationPrivate *this)

{
  QWidget *pQVar1;
  bool bVar2;
  QWidget **ppQVar3;
  QList<QWindow_*> *this_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  long in_FS_OFFSET;
  int i;
  QWidget *w;
  QWidgetList *__range1;
  QEvent ev_1;
  QEvent ev;
  const_iterator __end1;
  const_iterator __begin1;
  QWindowList windowList;
  QWidgetList list;
  QWindow **in_stack_ffffffffffffff58;
  QWidget *in_stack_ffffffffffffff60;
  int local_94;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QWindow *local_58;
  QWidget **local_50;
  const_iterator local_48;
  const_iterator local_40;
  QList<QWindow_*> local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  local_40.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_ffffffffffffff60);
  local_48.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QWidget_*>::end((QList<QWidget_*> *)in_stack_ffffffffffffff60);
  while( true ) {
    local_50 = local_48.i;
    bVar2 = QList<QWidget_*>::const_iterator::operator!=(&local_40,local_48);
    if (!bVar2) break;
    ppQVar3 = QList<QWidget_*>::const_iterator::operator*(&local_40);
    pQVar1 = *ppQVar3;
    local_58 = QWidget::windowHandle(in_stack_ffffffffffffff60);
    QList<QWindow*>::removeAll<QWindow*>
              ((QList<QWindow_*> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,ApplicationLayoutDirectionChange);
    QCoreApplication::sendEvent(&pQVar1->super_QObject,(QEvent *)&local_68);
    QEvent::~QEvent((QEvent *)&local_68);
    QList<QWidget_*>::const_iterator::operator++(&local_40);
  }
  local_94 = 0;
  while( true ) {
    this_00 = (QList<QWindow_*> *)(long)local_94;
    qVar4 = QList<QWindow_*>::size(&local_38);
    if (qVar4 <= (long)this_00) break;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_78,ApplicationLayoutDirectionChange);
    ppQVar5 = QList<QWindow_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff58);
    QCoreApplication::sendEvent((QObject *)*ppQVar5,(QEvent *)&local_78);
    QEvent::~QEvent((QEvent *)&local_78);
    local_94 = local_94 + 1;
  }
  QList<QWindow_*>::~QList((QList<QWindow_*> *)0x2cd949);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cd956);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyLayoutDirectionChange()
{
    const QWidgetList list = QApplication::topLevelWidgets();
    QWindowList windowList = QGuiApplication::topLevelWindows();

    // send to all top-level QWidgets
    for (auto *w : list) {
        windowList.removeAll(w->windowHandle());
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(w, &ev);
    }

    // in case there are any plain QWindows in this QApplication-using
    // application, also send the notification to them
    for (int i = 0; i < windowList.size(); ++i) {
        QEvent ev(QEvent::ApplicationLayoutDirectionChange);
        QCoreApplication::sendEvent(windowList.at(i), &ev);
    }
}